

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdVerifySignature(void *handle,int net_type,char *tx_hex,char *signature,int hash_type,
                      char *pubkey,char *script,char *txid,uint32_t vout,int sighash_type,
                      bool sighash_anyone_can_pay,int64_t value_satoshi,char *value_bytedata)

{
  bool bVar1;
  WitnessVersion WVar2;
  undefined4 extraout_var;
  CfdException *pCVar3;
  int iVar4;
  Script *pSVar5;
  allocator local_243;
  bool is_bitcoin;
  allocator local_241;
  Script local_240;
  undefined8 local_208;
  void *local_200;
  undefined1 local_1f8 [36];
  SigHashType sighashtype;
  ConfidentialValue value;
  ByteData signature_obj;
  string local_188;
  Amount amount;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  TransactionContext tx;
  OutPoint outpoint;
  SigHashType local_60;
  SigHashType local_54;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_200 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x851;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7e54;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_240);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x857;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7e54;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. signature is null or empty.",
               (allocator *)&local_240);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fe2f6;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x85d;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7e54;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"pubkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. pubkey is null or empty.",(allocator *)&local_240
              );
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  WVar2 = cfd::capi::GetWitnessVersion(hash_type);
  local_208 = CONCAT44(extraout_var,WVar2);
  cfd::core::Amount::Amount(&amount,value_satoshi);
  std::__cxx11::string::string((string *)&local_240,txid,(allocator *)&value);
  cfd::core::Txid::Txid((Txid *)&tx,(string *)&local_240);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&tx,vout);
  cfd::core::Txid::~Txid((Txid *)&tx);
  std::__cxx11::string::~string((string *)&local_240);
  cfd::core::SigHashType::Create(&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  std::__cxx11::string::string((string *)&tx,signature,(allocator *)&local_240);
  cfd::core::ByteData::ByteData(&signature_obj,(string *)&tx);
  std::__cxx11::string::~string((string *)&tx);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(net_type,&is_bitcoin);
  if (is_bitcoin != true) {
    cfd::core::ConfidentialValue::ConfidentialValue(&value);
    bVar1 = cfd::capi::IsEmptyString(value_bytedata);
    if (bVar1) {
      cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&tx,&amount);
      cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&tx);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&tx);
    }
    else {
      std::__cxx11::string::string((string *)&local_240,value_bytedata,(allocator *)local_1f8);
      cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&tx,(string *)&local_240)
      ;
      cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&tx);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&tx);
      std::__cxx11::string::~string((string *)&local_240);
    }
    std::__cxx11::string::string((string *)&local_240,tx_hex,(allocator *)local_1f8);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)&tx,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    bVar1 = cfd::capi::IsEmptyString(script);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString(pubkey);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_240,pubkey,(allocator *)&local_188);
        cfd::core::Pubkey::Pubkey((Pubkey *)local_1f8,(string *)&local_240);
        cfd::core::SigHashType::SigHashType(&local_60,&sighashtype);
        bVar1 = cfd::ConfidentialTransactionContext::VerifyInputSignature
                          ((ConfidentialTransactionContext *)&tx,&signature_obj,(Pubkey *)local_1f8,
                           &outpoint,&local_60,&value,(WitnessVersion)local_208);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8);
        pSVar5 = &local_240;
        goto LAB_0039ac91;
      }
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string((string *)local_1f8,pubkey,&local_243);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_158,(string *)local_1f8);
      std::__cxx11::string::string((string *)&local_188,script,&local_241);
      cfd::core::Script::Script(&local_240,&local_188);
      cfd::core::SigHashType::SigHashType(&local_54,&sighashtype);
      bVar1 = cfd::ConfidentialTransactionContext::VerifyInputSignature
                        ((ConfidentialTransactionContext *)&tx,&signature_obj,(Pubkey *)&local_158,
                         &outpoint,&local_240,&local_54,&value,(WitnessVersion)local_208);
      cfd::core::Script::~Script(&local_240);
      std::__cxx11::string::~string((string *)&local_188);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_158);
      pSVar5 = (Script *)local_1f8;
LAB_0039ac91:
      std::__cxx11::string::~string((string *)pSVar5);
    }
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)&tx);
    cfd::core::ConfidentialValue::~ConfidentialValue(&value);
    goto LAB_0039acb0;
  }
  std::__cxx11::string::string((string *)&local_240,tx_hex,(allocator *)&value);
  cfd::TransactionContext::TransactionContext(&tx,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  bVar1 = cfd::capi::IsEmptyString(script);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(pubkey);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_240,pubkey,(allocator *)local_1f8);
      cfd::core::Pubkey::Pubkey((Pubkey *)&value,(string *)&local_240);
      cfd::core::SigHashType::SigHashType(&local_48,&sighashtype);
      bVar1 = cfd::TransactionContext::VerifyInputSignature
                        (&tx,&signature_obj,(Pubkey *)&value,&outpoint,&local_48,&amount,
                         (WitnessVersion)local_208);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
      pSVar5 = &local_240;
      goto LAB_0039abf7;
    }
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&value,pubkey,(allocator *)&local_158);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_188,(string *)&value);
    std::__cxx11::string::string((string *)local_1f8,script,&local_243);
    cfd::core::Script::Script(&local_240,(string *)local_1f8);
    cfd::core::SigHashType::SigHashType(&local_3c,&sighashtype);
    bVar1 = cfd::TransactionContext::VerifyInputSignature
                      (&tx,&signature_obj,(Pubkey *)&local_188,&outpoint,&local_240,&local_3c,
                       &amount,(WitnessVersion)local_208);
    cfd::core::Script::~Script(&local_240);
    std::__cxx11::string::~string((string *)local_1f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
    pSVar5 = (Script *)&value;
LAB_0039abf7:
    std::__cxx11::string::~string((string *)pSVar5);
  }
  cfd::TransactionContext::~TransactionContext(&tx);
LAB_0039acb0:
  iVar4 = 7;
  if (bVar1 != false) {
    iVar4 = 0;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_obj);
  cfd::core::Txid::~Txid(&outpoint.txid_);
  return iVar4;
}

Assistant:

int CfdVerifySignature(
    void* handle, int net_type, const char* tx_hex, const char* signature,
    int hash_type, const char* pubkey, const char* script, const char* txid,
    uint32_t vout, int sighash_type, bool sighash_anyone_can_pay,
    int64_t value_satoshi, const char* value_bytedata) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    WitnessVersion version = GetWitnessVersion(hash_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData signature_obj(signature);

    bool is_verify = false;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      if (!IsEmptyString(script)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, Script(script),
            sighashtype, amount, version);
      } else if (!IsEmptyString(pubkey)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, sighashtype, amount,
            version);
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialValue value;
      if (!IsEmptyString(value_bytedata)) {
        value = ConfidentialValue(value_bytedata);
      } else {
        value = ConfidentialValue(amount);
      }
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(script)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, Script(script),
            sighashtype, value, version);
      } else if (!IsEmptyString(pubkey)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, sighashtype, value,
            version);
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}